

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

int GetCombinedHistogramEntropy
              (VP8LHistogram *a,VP8LHistogram *b,double cost_threshold,double *cost)

{
  double *in_RDX;
  long *in_RSI;
  uint32_t *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  uint32_t color_b;
  uint32_t color_r;
  uint32_t color_a;
  int trivial_at_end;
  int palette_code_bits;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  VP8LHistogramNumCodes(in_RDI[0x32a]);
  dVar1 = GetCombinedEntropy((uint32_t *)
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                             (int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                             (int)((ulong)in_XMM0_Qa >> 0x20),SUB84(in_XMM0_Qa,0));
  *in_RDX = dVar1 + *in_RDX;
  dVar1 = (*VP8LExtraCostCombined)
                    ((uint32_t *)(*(long *)in_RDI + 0x400),(uint32_t *)(*in_RSI + 0x400),0x18);
  *in_RDX = dVar1 + *in_RDX;
  if (*in_RDX <= in_XMM0_Qa) {
    dVar1 = GetCombinedEntropy((uint32_t *)
                               CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                               (int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                               (int)((ulong)in_XMM0_Qa >> 0x20),SUB84(in_XMM0_Qa,0));
    *in_RDX = dVar1 + *in_RDX;
    if (*in_RDX <= in_XMM0_Qa) {
      dVar1 = GetCombinedEntropy((uint32_t *)
                                 CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                 in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                                 (int)((ulong)in_XMM0_Qa >> 0x20),SUB84(in_XMM0_Qa,0));
      *in_RDX = dVar1 + *in_RDX;
      if (*in_RDX <= in_XMM0_Qa) {
        dVar1 = GetCombinedEntropy((uint32_t *)
                                   CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                   in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                                   (int)((ulong)in_XMM0_Qa >> 0x20),SUB84(in_XMM0_Qa,0));
        *in_RDX = dVar1 + *in_RDX;
        if (*in_RDX <= in_XMM0_Qa) {
          dVar1 = GetCombinedEntropy((uint32_t *)
                                     CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                     in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                                     (int)((ulong)in_XMM0_Qa >> 0x20),SUB84(in_XMM0_Qa,0));
          *in_RDX = dVar1 + *in_RDX;
          dVar1 = (*VP8LExtraCostCombined)(in_RDI + 0x302,(uint32_t *)(in_RSI + 0x181),0x28);
          *in_RDX = dVar1 + *in_RDX;
          if (*in_RDX <= in_XMM0_Qa) {
            iVar2 = 1;
          }
          else {
            iVar2 = 0;
          }
        }
        else {
          iVar2 = 0;
        }
      }
      else {
        iVar2 = 0;
      }
    }
    else {
      iVar2 = 0;
    }
  }
  else {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int GetCombinedHistogramEntropy(const VP8LHistogram* const a,
                                       const VP8LHistogram* const b,
                                       double cost_threshold,
                                       double* cost) {
  const int palette_code_bits = a->palette_code_bits_;
  int trivial_at_end = 0;
  assert(a->palette_code_bits_ == b->palette_code_bits_);
  *cost += GetCombinedEntropy(a->literal_, b->literal_,
                              VP8LHistogramNumCodes(palette_code_bits),
                              a->is_used_[0], b->is_used_[0], 0);
  *cost += VP8LExtraCostCombined(a->literal_ + NUM_LITERAL_CODES,
                                 b->literal_ + NUM_LITERAL_CODES,
                                 NUM_LENGTH_CODES);
  if (*cost > cost_threshold) return 0;

  if (a->trivial_symbol_ != VP8L_NON_TRIVIAL_SYM &&
      a->trivial_symbol_ == b->trivial_symbol_) {
    // A, R and B are all 0 or 0xff.
    const uint32_t color_a = (a->trivial_symbol_ >> 24) & 0xff;
    const uint32_t color_r = (a->trivial_symbol_ >> 16) & 0xff;
    const uint32_t color_b = (a->trivial_symbol_ >> 0) & 0xff;
    if ((color_a == 0 || color_a == 0xff) &&
        (color_r == 0 || color_r == 0xff) &&
        (color_b == 0 || color_b == 0xff)) {
      trivial_at_end = 1;
    }
  }

  *cost +=
      GetCombinedEntropy(a->red_, b->red_, NUM_LITERAL_CODES, a->is_used_[1],
                         b->is_used_[1], trivial_at_end);
  if (*cost > cost_threshold) return 0;

  *cost +=
      GetCombinedEntropy(a->blue_, b->blue_, NUM_LITERAL_CODES, a->is_used_[2],
                         b->is_used_[2], trivial_at_end);
  if (*cost > cost_threshold) return 0;

  *cost +=
      GetCombinedEntropy(a->alpha_, b->alpha_, NUM_LITERAL_CODES,
                         a->is_used_[3], b->is_used_[3], trivial_at_end);
  if (*cost > cost_threshold) return 0;

  *cost +=
      GetCombinedEntropy(a->distance_, b->distance_, NUM_DISTANCE_CODES,
                         a->is_used_[4], b->is_used_[4], 0);
  *cost +=
      VP8LExtraCostCombined(a->distance_, b->distance_, NUM_DISTANCE_CODES);
  if (*cost > cost_threshold) return 0;

  return 1;
}